

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void wallet::AppendLastProcessedBlock(UniValue *entry,CWallet *wallet)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  UniValue lastprocessedblock;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  char *in_stack_fffffffffffffd70;
  CWallet *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  UniValue *val;
  UniValue *in_stack_fffffffffffffda8;
  UniValue *in_stack_fffffffffffffdb0;
  allocator<char> local_231;
  int local_230;
  allocator<char> local_22a;
  allocator<char> local_229;
  UniValue local_228 [4];
  UniValue local_80;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
             (AnnotatedMixin<std::recursive_mutex> *)0x5e261a);
  val = &local_80;
  std::__cxx11::string::string(in_stack_fffffffffffffd80);
  UniValue::UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                     (VType)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                     (string *)in_stack_fffffffffffffd78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,(char *)in_stack_fffffffffffffdb0,(allocator<char> *)in_stack_fffffffffffffda8);
  CWallet::GetLastBlockHash(in_stack_fffffffffffffd78);
  base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffd80);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffda8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
  UniValue::pushKV(in_stack_fffffffffffffdb0,(string *)in_stack_fffffffffffffda8,val);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,(char *)in_stack_fffffffffffffdb0,(allocator<char> *)in_stack_fffffffffffffda8);
  local_230 = CWallet::GetLastBlockHeight(in_stack_fffffffffffffd78);
  UniValue::UniValue<int,_int,_true>(in_stack_fffffffffffffda8,(int *)val);
  UniValue::pushKV(in_stack_fffffffffffffdb0,(string *)in_stack_fffffffffffffda8,val);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  std::allocator<char>::~allocator(&local_22a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RSI,(char *)in_stack_fffffffffffffdb0,(allocator<char> *)in_stack_fffffffffffffda8);
  UniValue::UniValue(in_RDI,local_228);
  UniValue::pushKV(in_stack_fffffffffffffdb0,(string *)in_stack_fffffffffffffda8,val);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  std::allocator<char>::~allocator(&local_231);
  UniValue::~UniValue((UniValue *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AppendLastProcessedBlock(UniValue& entry, const CWallet& wallet)
{
    AssertLockHeld(wallet.cs_wallet);
    UniValue lastprocessedblock{UniValue::VOBJ};
    lastprocessedblock.pushKV("hash", wallet.GetLastBlockHash().GetHex());
    lastprocessedblock.pushKV("height", wallet.GetLastBlockHeight());
    entry.pushKV("lastprocessedblock", std::move(lastprocessedblock));
}